

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

uint64_t SHUFF_INPUT_ULONG(bit_io_t *bio,int64_t len)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong *puVar3;
  uint64_t uVar4;
  long lVar5;
  
  if (len == 0) {
    return 0;
  }
  uVar1 = bio->buff_btg;
  puVar3 = bio->in_u64;
  uVar2 = (*puVar3 << ((ulong)(byte)-(char)uVar1 & 0x3f)) >> ((ulong)(byte)-(char)len & 0x3f);
  uVar4 = uVar1 - len;
  if (uVar1 < (ulong)len || uVar4 == 0) {
    puVar3 = puVar3 + 1;
    lVar5 = len - uVar1;
    bio->in_u64 = puVar3;
    bio->buff_btg = 0x40;
    if (lVar5 < 1) {
      return uVar2;
    }
    uVar4 = 0x40 - lVar5;
    uVar2 = uVar2 | *puVar3 >> (-lVar5 & 0x3fU);
  }
  bio->buff_btg = uVar4;
  if (uVar4 != 0) {
    return uVar2;
  }
  bio->in_u64 = puVar3 + 1;
  bio->buff_btg = 0x40;
  return uVar2;
}

Assistant:

inline uint64_t SHUFF_INPUT_ULONG(bit_io_t* bio, int64_t len)
{
    if (len == 0)
        return 0;

    uint64_t n;

    if (bio->buff_btg == SHUFF_BUFF_BITS)
        n = (*bio->in_u64) >> (SHUFF_BUFF_BITS - len);
    else
        n = ((*bio->in_u64) << (SHUFF_BUFF_BITS - bio->buff_btg))
            >> (SHUFF_BUFF_BITS - len);

    if (len < bio->buff_btg)
        bio->buff_btg -= len;
    else {
        len -= bio->buff_btg;
        SHUFF_INPUT_NEXT(bio);
        if (len > 0) {
            n |= (*bio->in_u64) >> (SHUFF_BUFF_BITS - len);
            bio->buff_btg -= len;
        }
    }

    if (bio->buff_btg == 0)
        SHUFF_INPUT_NEXT(bio);

    return n;
}